

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExportRef
BinaryenAddGlobalExport(BinaryenModuleRef module,char *internalName,char *externalName)

{
  variant<wasm::Name,_wasm::HeapType> value;
  Export *this;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  string_view local_38;
  Export *local_28;
  Export *ret;
  char *externalName_local;
  char *internalName_local;
  BinaryenModuleRef module_local;
  
  ret = (Export *)externalName;
  externalName_local = internalName;
  internalName_local = (char *)module;
  this = (Export *)operator_new(0x30);
  wasm::Name::Name((Name *)&local_38,(char *)ret);
  std::variant<wasm::Name,wasm::HeapType>::variant<char_const*&,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&local_60,&externalName_local);
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_58;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = local_60;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_50;
  wasm::Export::Export(this,(Name)local_38,Global,value);
  local_28 = this;
  wasm::Module::addExport((Module *)internalName_local,this);
  return local_28;
}

Assistant:

BinaryenExportRef BinaryenAddGlobalExport(BinaryenModuleRef module,
                                          const char* internalName,
                                          const char* externalName) {
  auto* ret = new Export(externalName, ExternalKind::Global, internalName);
  ((Module*)module)->addExport(ret);
  return ret;
}